

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryAllocationTests.cpp
# Opt level: O2

void __thiscall
vkt::memory::anon_unknown_0::RandomAllocFreeTestInstance::~RandomAllocFreeTestInstance
          (RandomAllocFreeTestInstance *this)

{
  pointer pHVar1;
  long lVar2;
  VkDevice pVVar3;
  DeviceInterface *pDVar4;
  size_t objectNdx;
  ulong uVar5;
  long lVar6;
  deUint32 heapNdx;
  ulong uVar7;
  
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__RandomAllocFreeTestInstance_00bd39e0;
  pVVar3 = Context::getDevice((this->super_TestInstance).m_context);
  pDVar4 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  uVar7 = 0;
  while( true ) {
    pHVar1 = (this->m_heaps).
             super__Vector_base<vkt::memory::(anonymous_namespace)::Heap,_std::allocator<vkt::memory::(anonymous_namespace)::Heap>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((((long)(this->m_heaps).
                super__Vector_base<vkt::memory::(anonymous_namespace)::Heap,_std::allocator<vkt::memory::(anonymous_namespace)::Heap>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar1) / 0x50 & 0xffffffffU) <=
        uVar7) break;
    lVar6 = 0;
    for (uVar5 = 0;
        lVar2 = *(long *)&pHVar1[uVar7].objects.
                          super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
                          ._M_impl.super__Vector_impl_data,
        uVar5 < (ulong)((long)pHVar1[uVar7].objects.
                              super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
                              ._M_impl.super__Vector_impl_data._M_finish - lVar2 >> 4);
        uVar5 = uVar5 + 1) {
      lVar2 = *(long *)(lVar2 + lVar6);
      if (lVar2 != 0) {
        (*pDVar4->_vptr_DeviceInterface[6])(pDVar4,pVVar3,lVar2,0);
      }
      lVar6 = lVar6 + 0x10;
    }
    uVar7 = uVar7 + 1;
  }
  std::
  vector<vkt::memory::(anonymous_namespace)::Heap,_std::allocator<vkt::memory::(anonymous_namespace)::Heap>_>
  ::~vector(&this->m_heaps);
  return;
}

Assistant:

RandomAllocFreeTestInstance::~RandomAllocFreeTestInstance (void)
{
	const VkDevice							device				= m_context.getDevice();
	const DeviceInterface&					vkd					= m_context.getDeviceInterface();

	for (deUint32 heapNdx = 0; heapNdx < (deUint32)m_heaps.size(); heapNdx++)
	{
		const Heap&	heap	= m_heaps[heapNdx];

		for (size_t objectNdx = 0; objectNdx < heap.objects.size(); objectNdx++)
		{
			if (!!heap.objects[objectNdx].memory)
				vkd.freeMemory(device, heap.objects[objectNdx].memory, (const VkAllocationCallbacks*)DE_NULL);
		}
	}
}